

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

Vec_Int_t * Gia_ManCorrCreateRemapping(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int Entry;
  
  p_00 = Vec_IntAlloc(100);
  Entry = 0;
  while( true ) {
    if (p->nRegs <= Entry) {
      return p_00;
    }
    pObj = Gia_ManCi(p,(p->vCis->nSize - p->nRegs) + Entry);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjId(p,pObj);
    pObj_00 = Gia_ObjReprObj(p,iVar1);
    if (((pObj_00 != (Gia_Obj_t *)0x0) && ((~*(ulong *)pObj_00 & 0x1fffffff1fffffff) != 0)) &&
       (iVar1 = Gia_ObjId(p,pObj), (p->pReprs[iVar1].field_0x3 & 0x20) == 0)) {
      iVar1 = Gia_ObjIsRo(p,pObj_00);
      if (iVar1 == 0) {
        __assert_fail("Gia_ObjIsRo(p, pRepr)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCorr.c"
                      ,0x177,"Vec_Int_t *Gia_ManCorrCreateRemapping(Gia_Man_t *)");
      }
      iVar1 = Gia_ObjCioId(pObj_00);
      Vec_IntPush(p_00,(iVar1 - p->vCis->nSize) + p->nRegs);
      Vec_IntPush(p_00,Entry);
    }
    Entry = Entry + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_ManCorrCreateRemapping( Gia_Man_t * p )
{
    Vec_Int_t * vPairs;
    Gia_Obj_t * pObj, * pRepr;
    int i;
    vPairs = Vec_IntAlloc( 100 );
    Gia_ManForEachRo( p, pObj, i )
    {
        // skip ROs without representatives
        pRepr = Gia_ObjReprObj( p, Gia_ObjId(p,pObj) );
        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjFailed(p, Gia_ObjId(p,pObj)) )
//        if ( pRepr == NULL || Gia_ObjIsConst0(pRepr) || Gia_ObjIsFailedPair(p, Gia_ObjId(p, pRepr), Gia_ObjId(p, pObj)) )
            continue;
        assert( Gia_ObjIsRo(p, pRepr) );
//        Abc_Print( 1, "%d -> %d    ", Gia_ObjId(p,pObj), Gia_ObjId(p, pRepr) );
        // remember the pair
        Vec_IntPush( vPairs, Gia_ObjCioId(pRepr) - Gia_ManPiNum(p) );
        Vec_IntPush( vPairs, i );
    }
    return vPairs;
}